

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_PlotFileUtil.cpp
# Opt level: O0

void amrex::WriteGenericPlotfileHeader
               (ostream *HeaderFile,int nlevels,
               Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *bArray,
               Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *varnames,Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *geom,Real time,
               Vector<int,_std::allocator<int>_> *level_steps,
               Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *ref_ratio,
               string *versionName,string *levelPrefix,string *mfPrefix)

{
  CoordType CVar1;
  ostream *poVar2;
  Long LVar3;
  long lVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar5;
  Geometry *pGVar6;
  int *piVar7;
  Real *pRVar8;
  Geometry *this;
  Box *pBVar9;
  RealBox *this_00;
  int in_ESI;
  Geometry *in_RDI;
  double in_XMM0_Qa;
  Real RVar10;
  string *in_stack_00000010;
  int n;
  RealBox loc;
  Box result;
  Box *b;
  int i_6;
  IntVect *domain_lo;
  int level;
  int k;
  int i_5;
  int i_4;
  int i_3;
  int i_2;
  int i_1;
  int i;
  int ivar;
  int finest_level;
  undefined4 in_stack_fffffffffffffdd8;
  int in_stack_fffffffffffffddc;
  Geometry *in_stack_fffffffffffffde0;
  string *in_stack_fffffffffffffde8;
  BoxArray *in_stack_fffffffffffffdf0;
  Geometry *in_stack_fffffffffffffdf8;
  ostream *in_stack_fffffffffffffe00;
  Box *in_stack_fffffffffffffe10;
  ostream *in_stack_fffffffffffffe18;
  Geometry *in_stack_fffffffffffffe38;
  Geometry *in_stack_fffffffffffffe40;
  Geometry *in_stack_fffffffffffffe48;
  string local_170 [36];
  int local_14c;
  RealBox local_148;
  int local_118 [2];
  int local_110;
  IntVect local_104;
  undefined1 local_f8 [28];
  Box local_dc;
  Box *local_c0;
  int local_b4;
  IntVect *local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_9c;
  int local_98;
  int local_94;
  int local_90;
  int local_8c;
  int local_88;
  int local_84;
  double local_78;
  Geometry *local_50;
  undefined4 local_44;
  IntVect *local_40;
  IntVect *local_38;
  undefined1 *local_30;
  int local_28 [2];
  int local_20;
  IntVect *local_18;
  IntVect local_c;
  
  local_84 = in_ESI + -1;
  local_78 = in_XMM0_Qa;
  local_50 = in_RDI;
  std::ios_base::precision
            ((ios_base *)
             ((long)(in_RDI->super_CoordSys).offset +
             *(long *)(*(long *)&in_RDI->super_CoordSys + -0x18) + -8),0x11);
  poVar2 = std::operator<<((ostream *)local_50,in_stack_00000010);
  std::operator<<(poVar2,'\n');
  pGVar6 = local_50;
  LVar3 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x12e8918);
  poVar2 = (ostream *)std::ostream::operator<<(pGVar6,LVar3);
  std::operator<<(poVar2,'\n');
  local_88 = 0;
  while( true ) {
    lVar4 = (long)local_88;
    LVar3 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::size((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)0x12e895d);
    pGVar6 = local_50;
    if (LVar3 <= lVar4) break;
    pbVar5 = Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           *)in_stack_fffffffffffffde0,
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    poVar2 = std::operator<<((ostream *)pGVar6,(string *)pbVar5);
    std::operator<<(poVar2,"\n");
    local_88 = local_88 + 1;
  }
  poVar2 = (ostream *)std::ostream::operator<<(local_50,3);
  std::operator<<(poVar2,'\n');
  poVar2 = (ostream *)std::ostream::operator<<(local_50,local_78);
  std::operator<<(poVar2,'\n');
  poVar2 = (ostream *)std::ostream::operator<<(local_50,local_84);
  std::operator<<(poVar2,'\n');
  for (local_8c = 0; pGVar6 = local_50, local_8c < 3; local_8c = local_8c + 1) {
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    RVar10 = Geometry::ProbLo(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    poVar2 = (ostream *)std::ostream::operator<<(pGVar6,RVar10);
    std::operator<<(poVar2,' ');
  }
  std::operator<<((ostream *)local_50,'\n');
  for (local_90 = 0; pGVar6 = local_50, local_90 < 3; local_90 = local_90 + 1) {
    Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
              ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
               in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    RVar10 = Geometry::ProbHi(in_stack_fffffffffffffde0,in_stack_fffffffffffffddc);
    poVar2 = (ostream *)std::ostream::operator<<(pGVar6,RVar10);
    std::operator<<(poVar2,' ');
  }
  std::operator<<((ostream *)local_50,'\n');
  for (local_94 = 0; pGVar6 = local_50, local_94 < local_84; local_94 = local_94 + 1) {
    local_40 = Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_>::operator[]
                         ((Vector<amrex::IntVect,_std::allocator<amrex::IntVect>_> *)
                          in_stack_fffffffffffffde0,
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    local_44 = 0;
    poVar2 = (ostream *)std::ostream::operator<<(pGVar6,local_40->vect[0]);
    std::operator<<(poVar2,' ');
  }
  std::operator<<((ostream *)local_50,'\n');
  for (local_98 = 0; local_98 <= local_84; local_98 = local_98 + 1) {
    in_stack_fffffffffffffe48 = local_50;
    pGVar6 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_fffffffffffffde0,
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    Geometry::Domain(pGVar6);
    poVar2 = operator<<(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
    std::operator<<(poVar2,' ');
  }
  std::operator<<((ostream *)local_50,'\n');
  for (local_9c = 0; local_9c <= local_84; local_9c = local_9c + 1) {
    in_stack_fffffffffffffe40 = local_50;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe40,*piVar7);
    std::operator<<(poVar2,' ');
  }
  std::operator<<((ostream *)local_50,'\n');
  for (local_a0 = 0; pGVar6 = local_50, local_a0 <= local_84; local_a0 = local_a0 + 1) {
    for (local_a4 = 0; local_a4 < 3; local_a4 = local_a4 + 1) {
      in_stack_fffffffffffffe38 = local_50;
      pGVar6 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffffde0,
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      pRVar8 = CoordSys::CellSize(&pGVar6->super_CoordSys);
      poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe38,pRVar8[local_a4]);
      std::operator<<(poVar2,' ');
    }
    std::operator<<((ostream *)local_50,'\n');
  }
  this = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                   ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                    in_stack_fffffffffffffde0,
                    CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
  CVar1 = CoordSys::Coord(&this->super_CoordSys);
  poVar2 = (ostream *)std::ostream::operator<<(pGVar6,CVar1);
  std::operator<<(poVar2,'\n');
  std::operator<<((ostream *)local_50,"0\n");
  for (local_a8 = 0; local_a8 <= local_84; local_a8 = local_a8 + 1) {
    poVar2 = (ostream *)std::ostream::operator<<(local_50,local_a8);
    poVar2 = std::operator<<(poVar2,' ');
    Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
              ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
               in_stack_fffffffffffffde0,
               CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    LVar3 = BoxArray::size((BoxArray *)0x12e8e45);
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,LVar3);
    poVar2 = std::operator<<(poVar2,' ');
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,local_78);
    std::operator<<(poVar2,'\n');
    pGVar6 = local_50;
    piVar7 = Vector<int,_std::allocator<int>_>::operator[]
                       ((Vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffde0,
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    poVar2 = (ostream *)std::ostream::operator<<(pGVar6,*piVar7);
    std::operator<<(poVar2,'\n');
    pGVar6 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                       ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                        in_stack_fffffffffffffde0,
                        CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
    pBVar9 = Geometry::Domain(pGVar6);
    local_b0 = Box::smallEnd(pBVar9);
    local_b4 = 0;
    while( true ) {
      lVar4 = (long)local_b4;
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffde0,
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      LVar3 = BoxArray::size((BoxArray *)0x12e8f1a);
      if (LVar3 <= lVar4) break;
      Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_>::operator[]
                ((Vector<amrex::BoxArray,_std::allocator<amrex::BoxArray>_> *)
                 in_stack_fffffffffffffde0,
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      BoxArray::operator[]
                (in_stack_fffffffffffffdf0,(int)((ulong)in_stack_fffffffffffffde8 >> 0x20));
      local_18 = local_b0;
      IntVect::IntVect(&local_c,-local_b0->vect[0],-local_b0->vect[1],-local_b0->vect[2]);
      local_20 = local_c.vect[2];
      local_28[0] = local_c.vect[0];
      local_28[1] = local_c.vect[1];
      local_110 = local_c.vect[2];
      local_118[0] = local_c.vect[0];
      local_118[1] = local_c.vect[1];
      local_104.vect[0] = local_c.vect[0];
      local_104.vect[1] = local_c.vect[1];
      local_104.vect[2] = local_c.vect[2];
      local_30 = local_f8;
      local_38 = &local_104;
      Box::shift(&local_dc,local_38);
      pBVar9 = &local_dc;
      local_c0 = pBVar9;
      pGVar6 = Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                         ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                          in_stack_fffffffffffffde0,
                          CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      this_00 = (RealBox *)CoordSys::CellSize(&pGVar6->super_CoordSys);
      Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_>::operator[]
                ((Vector<amrex::Geometry,_std::allocator<amrex::Geometry>_> *)
                 in_stack_fffffffffffffde0,
                 CONCAT44(in_stack_fffffffffffffddc,in_stack_fffffffffffffdd8));
      Geometry::ProbLo((Geometry *)0x12e90aa);
      RealBox::RealBox(this_00,pBVar9,(Real *)in_stack_fffffffffffffe00,
                       (Real *)in_stack_fffffffffffffdf8);
      for (local_14c = 0; local_14c < 3; local_14c = local_14c + 1) {
        in_stack_fffffffffffffdf8 = local_50;
        RVar10 = RealBox::lo(&local_148,local_14c);
        poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffdf8,RVar10);
        in_stack_fffffffffffffe00 = std::operator<<(poVar2,' ');
        RVar10 = RealBox::hi(&local_148,local_14c);
        poVar2 = (ostream *)std::ostream::operator<<(in_stack_fffffffffffffe00,RVar10);
        std::operator<<(poVar2,'\n');
      }
      local_b4 = local_b4 + 1;
    }
    in_stack_fffffffffffffde8 = local_170;
    in_stack_fffffffffffffde0 = local_50;
    MultiFabHeaderPath((int)((ulong)in_stack_fffffffffffffe48 >> 0x20),
                       (string *)in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38);
    in_stack_fffffffffffffdf0 =
         (BoxArray *)std::operator<<((ostream *)in_stack_fffffffffffffde0,in_stack_fffffffffffffde8)
    ;
    std::operator<<((ostream *)in_stack_fffffffffffffdf0,'\n');
    std::__cxx11::string::~string(local_170);
  }
  return;
}

Assistant:

void
WriteGenericPlotfileHeader (std::ostream &HeaderFile,
                            int nlevels,
                            const Vector<BoxArray> &bArray,
                            const Vector<std::string> &varnames,
                            const Vector<Geometry> &geom,
                            Real time,
                            const Vector<int> &level_steps,
                            const Vector<IntVect> &ref_ratio,
                            const std::string &versionName,
                            const std::string &levelPrefix,
                            const std::string &mfPrefix)
{
//        BL_PROFILE("WriteGenericPlotfileHeader()");

        BL_ASSERT(nlevels <= bArray.size());
        BL_ASSERT(nlevels <= geom.size());
        BL_ASSERT(nlevels <= ref_ratio.size()+1);
        BL_ASSERT(nlevels <= level_steps.size());

        int finest_level(nlevels - 1);

        HeaderFile.precision(17);

        // ---- this is the generic plot file type name
        HeaderFile << versionName << '\n';

        HeaderFile << varnames.size() << '\n';

        for (int ivar = 0; ivar < varnames.size(); ++ivar) {
            HeaderFile << varnames[ivar] << "\n";
        }
        HeaderFile << AMREX_SPACEDIM << '\n';
        HeaderFile << time << '\n';
        HeaderFile << finest_level << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbLo(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < AMREX_SPACEDIM; ++i) {
            HeaderFile << geom[0].ProbHi(i) << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i < finest_level; ++i) {
            HeaderFile << ref_ratio[i][0] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << geom[i].Domain() << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            HeaderFile << level_steps[i] << ' ';
        }
        HeaderFile << '\n';
        for (int i = 0; i <= finest_level; ++i) {
            for (int k = 0; k < AMREX_SPACEDIM; ++k) {
                HeaderFile << geom[i].CellSize()[k] << ' ';
            }
            HeaderFile << '\n';
        }
        HeaderFile << (int) geom[0].Coord() << '\n';
        HeaderFile << "0\n";

        for (int level = 0; level <= finest_level; ++level) {
            HeaderFile << level << ' ' << bArray[level].size() << ' ' << time << '\n';
            HeaderFile << level_steps[level] << '\n';

            const IntVect& domain_lo = geom[level].Domain().smallEnd();
            for (int i = 0; i < bArray[level].size(); ++i)
            {
                // Need to shift because the RealBox ctor we call takes the
                // physical location of index (0,0,0).  This does not affect
                // the usual cases where the domain index starts with 0.
                const Box& b = amrex::shift(bArray[level][i], -domain_lo);
                RealBox loc = RealBox(b, geom[level].CellSize(), geom[level].ProbLo());
                for (int n = 0; n < AMREX_SPACEDIM; ++n) {
                    HeaderFile << loc.lo(n) << ' ' << loc.hi(n) << '\n';
                }
            }

            HeaderFile << MultiFabHeaderPath(level, levelPrefix, mfPrefix) << '\n';
        }
}